

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int runargs(lua_State *L,char **argv,int n)

{
  char cVar1;
  int local_40;
  char *local_38;
  char *extra;
  int status;
  int option;
  int i;
  int n_local;
  char **argv_local;
  lua_State *L_local;
  
  status = 1;
  do {
    if (n <= status) {
      return 1;
    }
    cVar1 = argv[status][1];
    if (cVar1 == 'W') {
      lua_warning(L,"@on",0);
    }
    else if ((cVar1 == 'e') || (cVar1 == 'l')) {
      local_38 = argv[status] + 2;
      if (*local_38 == '\0') {
        status = status + 1;
        local_38 = argv[status];
      }
      if (cVar1 == 'e') {
        local_40 = dostring(L,local_38,"=(command line)");
      }
      else {
        local_40 = dolibrary(L,local_38);
      }
      if (local_40 != 0) {
        return 0;
      }
    }
    status = status + 1;
  } while( true );
}

Assistant:

static int runargs (lua_State *L, char **argv, int n) {
  int i;
  for (i = 1; i < n; i++) {
    int option = argv[i][1];
    lua_assert(argv[i][0] == '-');  /* already checked */
    switch (option) {
      case 'e':  case 'l': {
        int status;
        char *extra = argv[i] + 2;  /* both options need an argument */
        if (*extra == '\0') extra = argv[++i];
        lua_assert(extra != NULL);
        status = (option == 'e')
                 ? dostring(L, extra, "=(command line)")
                 : dolibrary(L, extra);
        if (status != LUA_OK) return 0;
        break;
      }
      case 'W':
        lua_warning(L, "@on", 0);  /* warnings on */
        break;
    }
  }
  return 1;
}